

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  LogMessage *other;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  CopyingInputStreamAdaptor *local_10;
  CopyingInputStreamAdaptor *this_local;
  
  local_49 = 0;
  local_10 = this;
  if (this->backup_bytes_ != 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x15a);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: (backup_bytes_) == (0): ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  this->buffer_used_ = 0;
  internal::scoped_array<unsigned_char>::reset(&this->buffer_,(uchar *)0x0);
  return;
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  GOOGLE_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}